

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

ull getbf_as(bitfield *bf,ull *a,ull *m)

{
  byte bVar1;
  ull uVar2;
  byte bVar3;
  long lVar4;
  ull uVar5;
  int iVar6;
  
  iVar6 = bf->shr;
  uVar5 = 0;
  for (lVar4 = 0; bVar3 = (byte)iVar6, lVar4 != 2; lVar4 = lVar4 + 1) {
    uVar2 = bf_(bf->sbf[lVar4].pos,bf->sbf[lVar4].len,a,m);
    uVar5 = uVar5 | uVar2 << (bVar3 & 0x3f);
    iVar6 = iVar6 + bf->sbf[lVar4].len;
  }
  switch(bf->mode) {
  case BF_SIGNED:
    bVar1 = bVar3 - 1;
    break;
  case BF_SLIGHTLY_SIGNED:
    if ((uVar5 >> ((ulong)(byte)(bVar3 - 1) & 0x3f) & 1) == 0) goto switchD_0024c091_default;
    bVar1 = bVar3 - 2;
    break;
  case BF_ULTRASIGNED:
    goto switchD_0024c091_caseD_3;
  case BF_LUT:
    uVar5 = bf->lut[uVar5];
  default:
    goto switchD_0024c091_default;
  }
  if ((uVar5 >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
switchD_0024c091_caseD_3:
    uVar5 = uVar5 + (-1L << (bVar3 & 0x3f));
  }
switchD_0024c091_default:
  return (uVar5 ^ bf->xorend) + bf->addend;
}

Assistant:

ull getbf_as(const struct bitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}